

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O3

mbedtls_ssl_ciphersuite_t * mbedtls_ssl_ciphersuite_from_string(char *ciphersuite_name)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  int iVar2;
  mbedtls_ssl_ciphersuite_t *pmVar3;
  
  if (ciphersuite_name != (char *)0x0) {
    pmVar3 = ciphersuite_definitions;
    do {
      iVar2 = strcmp(pmVar3->name,ciphersuite_name);
      if (iVar2 == 0) {
        return pmVar3;
      }
      pmVar1 = pmVar3 + 1;
      pmVar3 = pmVar3 + 1;
    } while (pmVar1->id != 0);
  }
  return (mbedtls_ssl_ciphersuite_t *)0x0;
}

Assistant:

const mbedtls_ssl_ciphersuite_t *mbedtls_ssl_ciphersuite_from_string(
                                                const char *ciphersuite_name )
{
    const mbedtls_ssl_ciphersuite_t *cur = ciphersuite_definitions;

    if( NULL == ciphersuite_name )
        return( NULL );

    while( cur->id != 0 )
    {
        if( 0 == strcmp( cur->name, ciphersuite_name ) )
            return( cur );

        cur++;
    }

    return( NULL );
}